

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O0

void __thiscall sfc::Tile::Tile(Tile *this,Image *image,Mode mode,uint bpp,bool no_flip)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  runtime_error *this_00;
  byte *pbVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  byte local_8a;
  byte local_89;
  iterator iStack_88;
  index_t ip;
  iterator __end1;
  iterator __begin1;
  index_vec_t *__range1;
  undefined1 local_50 [7];
  index_t mask;
  byte local_21;
  uint local_20;
  Mode MStack_1c;
  bool no_flip_local;
  uint bpp_local;
  Mode mode_local;
  Image *image_local;
  Tile *this_local;
  
  this->_mode = mode;
  this->_bpp = bpp;
  local_21 = no_flip;
  local_20 = bpp;
  MStack_1c = mode;
  _bpp_local = image;
  image_local = (Image *)this;
  uVar3 = Image::width(image);
  this->_width = uVar3;
  uVar3 = Image::height(_bpp_local);
  this->_height = uVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&this->_mirrors);
  Image::palette(&this->_palette,_bpp_local);
  Image::indexed_data((index_vec_t *)local_50,_bpp_local);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  if (!bVar1) {
    bVar2 = bitmask_at_bpp(this->_bpp);
    Image::indexed_data((index_vec_t *)&__begin1,_bpp_local);
    __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__begin1);
    iStack_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__begin1);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        (&__end1,&stack0xffffffffffffff78);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end1);
      local_89 = *pbVar4;
      local_8a = local_89 & bVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->_data,&local_8a);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__begin1);
    if ((local_21 & 1) == 0) {
      mirror<unsigned_char>(&local_a8,&this->_data,this->_width,true,false);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&this->_mirrors,&local_a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
      mirror<unsigned_char>(&local_c0,&this->_data,this->_width,false,true);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&this->_mirrors,&local_c0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c0);
      mirror<unsigned_char>(&local_d8,&this->_data,this->_width,true,true);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&this->_mirrors,&local_d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t create tile without indexed data");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Tile::Tile(const Image& image, Mode mode, unsigned bpp, bool no_flip)
    : _mode(mode), _bpp(bpp), _width(image.width()), _height(image.height()), _palette(image.palette()) {
  if (image.indexed_data().empty())
    throw std::runtime_error("Can't create tile without indexed data");

  index_t mask = bitmask_at_bpp(_bpp);
  for (index_t ip : image.indexed_data())
    _data.push_back(ip & mask);

  if (!no_flip) {
    _mirrors.push_back(mirror(_data, _width, true, false));
    _mirrors.push_back(mirror(_data, _width, false, true));
    _mirrors.push_back(mirror(_data, _width, true, true));
  }
}